

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_directory.hpp
# Opt level: O1

void vfs::posix_directory::scan<vfs::directory_interface<vfs::posix_directory>>
               (path *dirPath,
               vector<vfs::directory_interface<vfs::posix_directory>,_std::allocator<vfs::directory_interface<vfs::posix_directory>_>_>
               *subDirectories,vector<vfs::path,_std::allocator<vfs::path>_> *files)

{
  char *p0;
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  size_t sVar3;
  char (*in_RCX) [256];
  path local_50;
  
  __dirp = opendir((dirPath->pathStr_)._M_dataplus._M_p);
  if (__dirp != (DIR *)0x0) {
    pdVar2 = readdir(__dirp);
    if (pdVar2 != (dirent *)0x0) {
      do {
        p0 = pdVar2->d_name;
        path::combine<char(&)[256]>(&local_50,dirPath,(path *)p0,in_RCX);
        if (pdVar2->d_type == '\x04') {
          sVar3 = strlen(p0);
          if (sVar3 == 2) {
            iVar1 = strncmp(p0,"..",2);
            if (iVar1 != 0) goto LAB_0013a3e7;
          }
          else if ((sVar3 != 1) || (*p0 != '.')) {
LAB_0013a3e7:
            std::
            vector<vfs::directory_interface<vfs::posix_directory>,std::allocator<vfs::directory_interface<vfs::posix_directory>>>
            ::emplace_back<vfs::path_const>
                      ((vector<vfs::directory_interface<vfs::posix_directory>,std::allocator<vfs::directory_interface<vfs::posix_directory>>>
                        *)subDirectories,&local_50);
          }
        }
        else if (pdVar2->d_type == '\b') {
          std::vector<vfs::path,std::allocator<vfs::path>>::emplace_back<vfs::path_const>
                    ((vector<vfs::path,std::allocator<vfs::path>> *)files,&local_50);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50.pathStr_._M_dataplus._M_p != &local_50.pathStr_.field_2) {
          operator_delete(local_50.pathStr_._M_dataplus._M_p,
                          local_50.pathStr_.field_2._M_allocated_capacity + 1);
        }
        pdVar2 = readdir(__dirp);
      } while (pdVar2 != (dirent *)0x0);
    }
    closedir(__dirp);
  }
  return;
}

Assistant:

static void scan(const path &dirPath, std::vector<_Dir> &subDirectories, std::vector<path> &files)
        {
            DIR *pDir = opendir(dirPath.c_str());
            if (pDir == nullptr)
            {
                return;
            }

            struct dirent *pEntry = nullptr;
            while ((pEntry = readdir(pDir)) != nullptr)
            {
                const auto &currentFilePath = path::combine(dirPath, pEntry->d_name);

                if (pEntry->d_type == DT_REG)
                {
                    files.emplace_back(std::move(currentFilePath));
                }
                else if (pEntry->d_type == DT_DIR)
                {
                    const auto nameLen = strlen(pEntry->d_name);
                    if (!((nameLen == 1 && pEntry->d_name[0] == '.') ||
                          (nameLen == 2 && strncmp(pEntry->d_name, "..", 2) == 0)))
                    {
                        subDirectories.emplace_back(std::move(currentFilePath));
                    }
                }
            }

            closedir(pDir);
        }